

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O1

uint __thiscall
GeneralHash<1,unsigned_int,unsigned_char>::
hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
          (GeneralHash<1,unsigned_int,unsigned_char> *this,
          deque<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  _Map_pointer ppuVar1;
  _Elt_pointer puVar2;
  _Map_pointer ppuVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  _Elt_pointer puVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  ppuVar1 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  puVar2 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  ppuVar3 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Deque_impl_data._M_start._M_node;
  puVar7 = (c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Deque_impl_data._M_start._M_last +
           (long)((c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_finish._M_cur +
                 (((((ulong)((long)ppuVar1 - (long)ppuVar3) >> 3) - 1) +
                  (ulong)(ppuVar1 == (_Map_pointer)0x0)) * 0x200 -
                 (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                       .super__Deque_impl_data._M_finish._M_first));
  uVar5 = 0;
  if (puVar7 != puVar2) {
    uVar8 = (long)puVar2 -
            (long)(c->super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uVar9 = 0;
    uVar6 = 1;
    uVar5 = 0;
    do {
      uVar4 = uVar5 * 2;
      uVar5 = *(uint *)(this + 0xc) ^ uVar4;
      if ((*(uint *)(this + 0x410) & ~uVar4) != 0) {
        uVar5 = uVar4;
      }
      if (uVar8 < 0x200) {
        pbVar10 = puVar2 + uVar9;
      }
      else {
        uVar9 = (uVar8 >> 9) + 0xff80000000000000;
        if (0 < (long)uVar8) {
          uVar9 = uVar8 >> 9;
        }
        pbVar10 = ppuVar3[uVar9] + uVar8 + uVar9 * -0x200;
      }
      uVar5 = uVar5 ^ *(uint *)(this + (ulong)*pbVar10 * 4 + 0x10);
      uVar9 = (ulong)uVar6;
      uVar8 = uVar8 + 1;
      uVar6 = uVar6 + 1;
    } while (uVar9 < (ulong)((long)puVar7 - (long)puVar2));
  }
  return uVar5;
}

Assistant:

hashvaluetype hash(container &c) const {
    hashvaluetype answer(0);
    for (uint k = 0; k < c.size(); ++k) {
      fastleftshift(answer, 1);
      answer ^= hasher.hashvalues[c[k]];
    }
    return answer;
  }